

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v11::basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_>::move
          (basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *this,
          basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *other)

{
  buffer<char> *buf_data;
  size_t sVar1;
  size_t buf_capacity;
  buffer<char> *in_RSI;
  basic_memory_buffer<char,_250UL,_fmt::v11::detail::allocator<char>_> *in_RDI;
  size_t capacity;
  size_t size;
  char *data;
  size_t in_stack_ffffffffffffffc8;
  
  buf_data = (buffer<char> *)v11::detail::buffer<char>::data(in_RSI);
  sVar1 = v11::detail::buffer<char>::size(in_RSI);
  buf_capacity = v11::detail::buffer<char>::capacity(in_RSI);
  if (buf_data == in_RSI + 1) {
    v11::detail::buffer<char>::set(&in_RDI->super_buffer<char>,in_RDI->store_,buf_capacity);
    v11::detail::copy<char,_char_*,_char_*,_0>
              ((char *)(in_RSI + 1),(char *)((long)&in_RSI[1].ptr_ + sVar1),in_RDI->store_);
  }
  else {
    v11::detail::buffer<char>::set(&in_RDI->super_buffer<char>,(char *)buf_data,buf_capacity);
    v11::detail::buffer<char>::set(in_RSI,(char *)(in_RSI + 1),0);
    v11::detail::buffer<char>::clear(in_RSI);
  }
  resize(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

FMT_CONSTEXPR20 void move(basic_memory_buffer& other) {
    alloc_ = std::move(other.alloc_);
    T* data = other.data();
    size_t size = other.size(), capacity = other.capacity();
    if (data == other.store_) {
      this->set(store_, capacity);
      detail::copy<T>(other.store_, other.store_ + size, store_);
    } else {
      this->set(data, capacity);
      // Set pointer to the inline array so that delete is not called
      // when deallocating.
      other.set(other.store_, 0);
      other.clear();
    }
    this->resize(size);
  }